

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::FillColumnAddClampPalCommand::Execute
          (FillColumnAddClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  int core_skip;
  byte *pbVar6;
  int iVar7;
  int pass_skip;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  iVar7 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar9 = thread->pass_end_y - iVar7;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (iVar1 < iVar9) {
    iVar9 = iVar1;
  }
  uVar8 = thread->pass_start_y - iVar7;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar1 = thread->num_cores;
  iVar7 = (iVar1 - (int)((iVar7 + uVar8) - thread->core) % iVar1) % iVar1;
  uVar4 = (long)(int)((~uVar8 + iVar1 + iVar9) - iVar7) / (long)iVar1;
  uVar5 = uVar4 & 0xffffffff;
  if (0 < (int)uVar4) {
    puVar3 = (this->super_PalColumnCommand)._destblend;
    iVar9 = (this->super_PalColumnCommand)._pitch;
    pbVar6 = (this->super_PalColumnCommand)._dest + (int)((iVar7 + uVar8) * iVar9);
    uVar2 = (this->super_PalColumnCommand)._srccolor;
    do {
      uVar8 = puVar3[*pbVar6] + uVar2;
      uVar10 = uVar8 & 0x40100400;
      uVar8 = uVar10 - (uVar10 >> 5) | uVar8 & 0x3e0f83e0 | 0x1f07c1f;
      *pbVar6 = RGB32k.All[uVar8 >> 0xf & uVar8];
      pbVar6 = pbVar6 + iVar1 * iVar9;
      uVar8 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void FillColumnAddClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;

		dest = _dest;
		uint32_t *bg2rgb;
		uint32_t fg;

		bg2rgb = _destblend;
		fg = _srccolor;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		do
		{
			uint32_t a = fg + bg2rgb[*dest];
			uint32_t b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
		} while (--count);
	}